

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::Model::AddBody
          (Model *this,uint parent_id,SpatialTransform *joint_frame,Joint *joint,Body *body,
          string *body_name)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  SpatialTransform *this_00;
  long lVar7;
  mapped_type *pmVar8;
  double *v2;
  double *v1;
  SpatialVector_t *this_01;
  double *v5;
  double *v3;
  double *pdVar9;
  reference pvVar10;
  ostream *poVar11;
  const_iterator __position;
  pair<RigidBodyDynamics::JointType,_unsigned_int> *ppVar12;
  reference pvVar13;
  pointer ppVar14;
  value_type_conflict *__x;
  long in_RCX;
  uint in_ESI;
  long in_RDI;
  string *in_R9;
  iterator type_iter;
  JointType current_joint_type;
  uint i_2;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  joint_types;
  SpatialRigidBodyInertia rbi;
  uint i_1;
  int multdof3_joint_counter;
  uint last_q_index;
  uint i;
  uint lambda_q_last;
  uint fbody_id;
  SpatialTransform movable_parent_transform;
  uint movable_parent_id;
  SpatialTransform *in_stack_fffffffffffff4e8;
  value_type *pvVar15;
  value_type *pvVar16;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  *other;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *other_00;
  value_type *__x_00;
  iterator in_stack_fffffffffffff4f0;
  value_type *in_stack_fffffffffffff4f8;
  vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
  *in_stack_fffffffffffff500;
  Model *in_stack_fffffffffffff508;
  SpatialTransform *in_stack_fffffffffffff510;
  key_type *in_stack_fffffffffffff528;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffff530;
  undefined4 in_stack_fffffffffffff548;
  value_type in_stack_fffffffffffff54c;
  double *in_stack_fffffffffffff550;
  double *in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff56c;
  SpatialVector_t *in_stack_fffffffffffff570;
  double *in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff5b0;
  mapped_type in_stack_fffffffffffff5b4;
  Matrix3d *in_stack_fffffffffffff668;
  Vector3d *in_stack_fffffffffffff670;
  double in_stack_fffffffffffff678;
  __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
  local_980;
  JointType local_974;
  JointType local_970;
  pair<RigidBodyDynamics::JointType,_unsigned_int> local_96c;
  uint local_964;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  local_960;
  value_type local_948;
  undefined8 local_940;
  undefined8 local_938;
  undefined8 local_930;
  undefined8 local_928;
  undefined8 local_920;
  value_type local_898 [3];
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  value_type local_7a8;
  string *in_stack_fffffffffffff898;
  Body *in_stack_fffffffffffff8a0;
  Joint *in_stack_fffffffffffff8a8;
  SpatialTransform *in_stack_fffffffffffff8b0;
  uint in_stack_fffffffffffff8bc;
  Model *in_stack_fffffffffffff8c0;
  string *in_stack_fffffffffffff8e8;
  Body *in_stack_fffffffffffff8f0;
  Joint *in_stack_fffffffffffff8f8;
  SpatialTransform *in_stack_fffffffffffff900;
  uint in_stack_fffffffffffff90c;
  Model *in_stack_fffffffffffff910;
  undefined8 local_618;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  uint local_554;
  int local_550;
  undefined4 local_54c;
  value_type local_388 [2];
  uint local_2bc;
  value_type local_2b8;
  value_type local_258 [2];
  _Self local_1f0;
  _Self local_1e8 [25];
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  int local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_8c;
  string local_88 [48];
  string local_58 [48];
  long local_28;
  uint local_14;
  uint local_4;
  
  if (*(int *)(in_RCX + 8) == 0xb) {
    std::__cxx11::string::string(local_58,in_R9);
    uVar2 = AddBodyFixedJoint(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                              in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                              in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    *(uint *)(in_RDI + 0x54) = uVar2;
    std::__cxx11::string::~string(local_58);
    local_4 = *(uint *)(in_RDI + 0x54);
  }
  else if ((((((*(int *)(in_RCX + 8) == 6) || (*(int *)(in_RCX + 8) == 7)) ||
             (*(int *)(in_RCX + 8) == 8)) ||
            ((*(int *)(in_RCX + 8) == 9 || (*(int *)(in_RCX + 8) == 10)))) ||
           ((*(int *)(in_RCX + 8) == 2 ||
            ((*(int *)(in_RCX + 8) == 1 || (*(int *)(in_RCX + 8) == 3)))))) ||
          ((*(int *)(in_RCX + 8) == 4 || (*(int *)(in_RCX + 8) == 5)))) {
    local_8c = in_ESI;
    local_28 = in_RCX;
    local_14 = in_ESI;
    Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff510);
    bVar1 = IsFixedBodyId(in_stack_fffffffffffff508,(uint)((ulong)in_stack_fffffffffffff500 >> 0x20)
                         );
    if (bVar1) {
      local_f4 = local_14 - *(int *)(in_RDI + 0x300);
      pvVar4 = std::
               vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                             *)(in_RDI + 0x2e8),(ulong)local_f4);
      local_8c = pvVar4->mMovableParent;
      std::
      vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
      ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    *)(in_RDI + 0x2e8),(ulong)local_f4);
      Math::SpatialTransform::operator=
                ((SpatialTransform *)in_stack_fffffffffffff4f0._M_current,in_stack_fffffffffffff4e8)
      ;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff500,
               (value_type_conflict *)in_stack_fffffffffffff4f8);
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar5 - 1);
    local_f8 = pvVar6->q_index;
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar5 - 1);
    uVar2 = local_f8;
    if (pvVar6->mDoFCount != 0) {
      sVar5 = std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      *)(in_RDI + 0xa0));
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),sVar5 - 1);
      local_f8 = uVar2 + pvVar6->mDoFCount;
    }
    for (local_fc = 0; local_fc < *(uint *)(local_28 + 0xc); local_fc = local_fc + 1) {
      local_100 = local_f8 + local_fc;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffff4f0._M_current,
                 (value_type_conflict *)in_stack_fffffffffffff4e8);
    }
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x23b244);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)in_stack_fffffffffffff4f0._M_current,(value_type *)in_stack_fffffffffffff4e8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff500);
    this_00 = (SpatialTransform *)
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)in_stack_fffffffffffff4f0._M_current,(size_type)in_stack_fffffffffffff4e8);
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 0x308));
    local_11c = (undefined4)sVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type_conflict *)in_stack_fffffffffffff4e8
              );
    Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff510);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 *)in_stack_fffffffffffff4f0._M_current,in_stack_fffffffffffff4e8);
    Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff510);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 *)in_stack_fffffffffffff4f0._M_current,in_stack_fffffffffffff4e8);
    std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
    push_back(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
    lVar7 = std::__cxx11::string::size();
    if (lVar7 != 0) {
      local_1e8[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)in_stack_fffffffffffff4e8,(key_type *)0x23b379);
      local_1f0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)in_stack_fffffffffffff4e8);
      bVar1 = std::operator!=(local_1e8,&local_1f0);
      if (bVar1) {
        poVar11 = std::operator<<((ostream *)&std::cerr,"Error: Body with name \'");
        poVar11 = std::operator<<(poVar11,in_R9);
        poVar11 = std::operator<<(poVar11,"\' already exists!");
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        abort();
      }
      sVar5 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 0x308));
      in_stack_fffffffffffff5b4 = (int)sVar5 - 1;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](in_stack_fffffffffffff530,in_stack_fffffffffffff528);
      *pmVar8 = in_stack_fffffffffffff5b4;
    }
    v2 = (double *)(in_RDI + 0x70);
    local_258[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_258[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_258[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_258[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_258[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_258[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pvVar15 = local_258;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff570,
               (double *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
               in_stack_fffffffffffff560,v2,in_stack_fffffffffffff550,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
               in_stack_fffffffffffff580);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,pvVar15);
    v1 = (double *)(in_RDI + 0x88);
    local_2b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_2b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = 0.0;
    local_2b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 0.0;
    local_2b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = 0.0;
    local_2b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = 0.0;
    local_2b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = 0.0;
    pvVar16 = &local_2b8;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffff570,
               (double *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),v1,v2,
               in_stack_fffffffffffff550,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
               in_stack_fffffffffffff580);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type *)pvVar16);
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    local_2bc = (int)sVar5 - 1;
    std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
    push_back((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_2bc);
    uVar2 = pvVar6->q_index;
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_2bc);
    uVar3 = uVar2 + pvVar6->mDoFCount;
    this_01 = (SpatialVector_t *)(in_RDI + 0xa0);
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)this_01,sVar5 - 1);
    pvVar6->q_index = uVar3;
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
    v5 = (double *)(in_RDI + 0xd0);
    Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff510);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 *)in_stack_fffffffffffff4f0._M_current,pvVar16);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
    local_388[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 0.0;
    local_388[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = 0.0;
    local_388[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 0.0;
    local_388[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = 0.0;
    local_388[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = 0.0;
    local_388[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = 0.0;
    pvVar16 = local_388;
    SpatialVector_t::SpatialVector_t
              (this_01,(double *)CONCAT44(uVar2,in_stack_fffffffffffff568),v1,v2,
               in_stack_fffffffffffff550,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),v5);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type *)pvVar16);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero
              ((Index)in_stack_fffffffffffff4f8,(Index)in_stack_fffffffffffff4f0._M_current);
    Eigen::Matrix<double,6,3,0,6,3>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
              ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff4f0._M_current,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                *)pvVar16);
    std::
    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
    ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                 *)in_stack_fffffffffffff4f0._M_current,(value_type *)pvVar16);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero();
    Eigen::Matrix<double,6,3,0,6,3>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
              ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff4f0._M_current,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                *)pvVar16);
    std::
    vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
    ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                 *)in_stack_fffffffffffff4f0._M_current,(value_type *)pvVar16);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
    Matrix3_t::
    Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
              ((Matrix3_t *)in_stack_fffffffffffff4f0._M_current,
               (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)pvVar16);
    std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back
              ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)in_stack_fffffffffffff4f0._M_current
               ,&pvVar16->E);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    Vector3_t::
    Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((Vector3_t *)in_stack_fffffffffffff4f0._M_current,
               (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)pvVar16);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffff4f0._M_current
               ,(value_type *)pvVar16);
    local_54c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type_conflict *)pvVar16);
    *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + *(int *)(local_28 + 0xc);
    local_550 = 0;
    local_554 = 1;
    while( true ) {
      v3 = (double *)(ulong)local_554;
      pdVar9 = (double *)
               std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0));
      if (pdVar9 <= v3) break;
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),(ulong)local_554);
      if (pvVar6->mJointType == JointTypeSpherical) {
        in_stack_fffffffffffff54c = *(int *)(in_RDI + 0x48) + local_550;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1c0)
                             ,(ulong)local_554);
        *pvVar10 = in_stack_fffffffffffff54c;
        local_550 = local_550 + 1;
      }
      local_554 = local_554 + 1;
    }
    *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x48) + local_550;
    *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + *(int *)(local_28 + 0xc);
    Math::SpatialTransform::operator*
              (this_00,(SpatialTransform *)
                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 *)in_stack_fffffffffffff4f0._M_current,pvVar16);
    local_5f0 = 0;
    local_5f8 = 0;
    local_600 = 0;
    local_608 = 0;
    local_610 = 0;
    local_618 = 0;
    other = (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
             *)&local_618;
    SpatialVector_t::SpatialVector_t
              (this_01,(double *)CONCAT44(uVar2,in_stack_fffffffffffff568),v1,v2,v3,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),v5);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type *)other);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Zero
              ((Index)in_stack_fffffffffffff4f8,(Index)in_stack_fffffffffffff4f0._M_current);
    SpatialMatrix_t::
    SpatialMatrix_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
              ((SpatialMatrix_t *)in_stack_fffffffffffff4f0._M_current,other);
    std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::push_back
              ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type *)other);
    local_7a8.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_7a8.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_7a8.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_7a8.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_7a8.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_7a8.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pvVar15 = &local_7a8;
    SpatialVector_t::SpatialVector_t
              (this_01,(double *)CONCAT44(uVar2,in_stack_fffffffffffff568),v1,v2,v3,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),v5);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,pvVar15);
    local_7e0 = 0;
    local_7e8 = 0;
    local_7f0 = 0;
    local_7f8 = 0;
    local_800 = 0;
    local_808 = 0;
    other_00 = (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_808;
    SpatialVector_t::SpatialVector_t
              (this_01,(double *)CONCAT44(uVar2,in_stack_fffffffffffff568),v1,v2,v3,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),v5);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type *)other_00);
    std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
              ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 0x308));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((Index)in_stack_fffffffffffff4f8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff4f0._M_current,other_00);
    std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
              ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 0x308));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((Index)in_stack_fffffffffffff4f8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff4f0._M_current,other_00);
    local_898[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    local_898[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    local_898[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    local_898[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    local_898[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    local_898[0].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pvVar15 = local_898;
    SpatialVector_t::SpatialVector_t
              (this_01,(double *)CONCAT44(uVar2,in_stack_fffffffffffff568),v1,v2,v3,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),v5);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,pvVar15);
    Math::SpatialRigidBodyInertia::createFromMassComInertiaC
              (in_stack_fffffffffffff678,in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
    local_920 = 0;
    local_928 = 0;
    local_930 = 0;
    local_938 = 0;
    local_940 = 0;
    local_948.first = JointTypeUndefined;
    local_948.second = 0;
    __x_00 = &local_948;
    SpatialVector_t::SpatialVector_t
              (this_01,(double *)CONCAT44(uVar2,in_stack_fffffffffffff568),v1,v2,v3,
               (double *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),v5);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               in_stack_fffffffffffff4f0._M_current,(value_type *)__x_00);
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 0x308));
    if (sVar5 == *(uint *)(in_RDI + 0x300)) {
      poVar11 = std::operator<<((ostream *)&std::cerr,"Error: cannot add more than ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,*(uint *)(in_RDI + 0x300));
      poVar11 = std::operator<<(poVar11,
                                " movable bodies. You need to modify Model::fixed_body_discriminator for this."
                               );
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      abort();
    }
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 0x308));
    *(int *)(in_RDI + 0x54) = (int)sVar5 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x23bfa0);
    std::
    vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ::vector((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
              *)0x23bfad);
    local_964 = 0;
    while( true ) {
      __position._M_current = (pair<RigidBodyDynamics::JointType,_unsigned_int> *)(ulong)local_964;
      ppVar12 = (pair<RigidBodyDynamics::JointType,_unsigned_int> *)
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(in_RDI + 0xa0));
      if (ppVar12 <= __position._M_current) break;
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),(ulong)local_964);
      std::pair<RigidBodyDynamics::JointType,_unsigned_int>::
      pair<RigidBodyDynamics::JointType_&,_unsigned_int_&,_true>
                (&local_96c,&pvVar6->mJointType,&local_964);
      std::
      vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ::push_back((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   *)in_stack_fffffffffffff4f0._M_current,__x_00);
      in_stack_fffffffffffff500 =
           (vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
           (in_RDI + 0x118);
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),(ulong)local_964);
      local_970 = pvVar6->mJointType;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffff4f0._M_current,&__x_00->first);
      local_964 = local_964 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x23c0d6);
    local_974 = JointTypeUndefined;
    while (sVar5 = std::
                   vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   ::size(&local_960), sVar5 != 0) {
      pvVar13 = std::
                vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                ::operator[](&local_960,0);
      local_974 = pvVar13->first;
      local_980._M_current =
           (pair<RigidBodyDynamics::JointType,_unsigned_int> *)
           std::
           vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
           ::begin((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                    *)__x_00);
      while( true ) {
        std::
        vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ::end((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               *)__x_00);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                            *)in_stack_fffffffffffff4f0._M_current,
                           (__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                            *)__x_00);
        if (!bVar1) break;
        ppVar14 = __gnu_cxx::
                  __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                  ::operator->(&local_980);
        if (ppVar14->first == local_974) {
          __x = (value_type_conflict *)(in_RDI + 0x118);
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
          ::operator->(&local_980);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff500,__x);
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,unsigned_int>const*,std::vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>>
          ::__normal_iterator<std::pair<RigidBodyDynamics::JointType,unsigned_int>*>
                    ((__normal_iterator<const_std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                      *)in_stack_fffffffffffff4f0._M_current,
                     (__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                      *)__x_00);
          in_stack_fffffffffffff4f0 =
               std::
               vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               ::erase((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                        *)in_stack_fffffffffffff500,__position);
          local_980._M_current = in_stack_fffffffffffff4f0._M_current;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
          ::operator++(&local_980);
        }
      }
    }
    local_4 = *(uint *)(in_RDI + 0x54);
    std::
    vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ::~vector((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               *)in_stack_fffffffffffff500);
  }
  else {
    std::__cxx11::string::string(local_88,in_R9);
    uVar2 = AddBodyMultiDofJoint
                      (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b0
                       ,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                       in_stack_fffffffffffff898);
    *(uint *)(in_RDI + 0x54) = uVar2;
    std::__cxx11::string::~string(local_88);
    local_4 = *(uint *)(in_RDI + 0x54);
  }
  return local_4;
}

Assistant:

unsigned int Model::AddBody (const unsigned int parent_id,
		const SpatialTransform &joint_frame,
		const Joint &joint,
		const Body &body,
		std::string body_name) {
	assert (lambda.size() > 0);
	assert (joint.mJointType != JointTypeUndefined);

	if (joint.mJointType == JointTypeFixed) {
		previously_added_body_id = AddBodyFixedJoint (*this, parent_id, joint_frame, joint, body, body_name);
		return previously_added_body_id;
	} else if ( (joint.mJointType == JointTypeSpherical) 
			|| (joint.mJointType == JointTypeEulerZYX) 
			|| (joint.mJointType == JointTypeEulerXYZ) 
			|| (joint.mJointType == JointTypeEulerYXZ) 
			|| (joint.mJointType == JointTypeTranslationXYZ) ) {
		// no action required
	} else if (joint.mJointType != JointTypePrismatic 
			&& joint.mJointType != JointTypeRevolute
			&& joint.mJointType != JointTypeRevoluteX
			&& joint.mJointType != JointTypeRevoluteY
			&& joint.mJointType != JointTypeRevoluteZ
			) {
		previously_added_body_id = AddBodyMultiDofJoint (*this, parent_id, joint_frame, joint, body, body_name);
		return previously_added_body_id;
	}

	// If we add the body to a fixed body we have to make sure that we
	// actually add it to its movable parent.
	unsigned int movable_parent_id = parent_id;
	SpatialTransform movable_parent_transform;

	if (IsFixedBodyId(parent_id)) {
		unsigned int fbody_id = parent_id - fixed_body_discriminator;
		movable_parent_id = mFixedBodies[fbody_id].mMovableParent;
		movable_parent_transform = mFixedBodies[fbody_id].mParentTransform;
	}

	// structural information
	lambda.push_back(movable_parent_id);
	unsigned int lambda_q_last = mJoints[mJoints.size() - 1].q_index;
	if (mJoints[mJoints.size() - 1].mDoFCount > 0)
		lambda_q_last = lambda_q_last + mJoints[mJoints.size() - 1].mDoFCount;
	for (unsigned int i = 0; i < joint.mDoFCount; i++) {
		lambda_q.push_back(lambda_q_last + i);
	}
	mu.push_back(std::vector<unsigned int>());
	mu.at(movable_parent_id).push_back(mBodies.size());

	// Bodies
	X_lambda.push_back(SpatialTransform());
	X_base.push_back(SpatialTransform());
	mBodies.push_back(body);

	if (body_name.size() != 0) {
		if (mBodyNameMap.find(body_name) != mBodyNameMap.end()) {
			std::cerr << "Error: Body with name '" << body_name << "' already exists!" << std::endl;
			assert (0);
			abort();
		}
		mBodyNameMap[body_name] = mBodies.size() - 1;
	}

	// state information
	v.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	a.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

	// Joints
	unsigned int last_q_index = mJoints.size() - 1;
	mJoints.push_back(joint);
	mJoints[mJoints.size() - 1].q_index = mJoints[last_q_index].q_index + mJoints[last_q_index].mDoFCount; 

	S.push_back (joint.mJointAxes[0]);

	// Joint state variables
	X_J.push_back (SpatialTransform());
	v_J.push_back (joint.mJointAxes[0]);
	c_J.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

	// workspace for joints with 3 dof
	multdof3_S.push_back (Matrix63::Zero(6,3));
	multdof3_U.push_back (Matrix63::Zero());
	multdof3_Dinv.push_back (Matrix3d::Zero());
	multdof3_u.push_back (Vector3d::Zero());
	multdof3_w_index.push_back (0);

	dof_count = dof_count + joint.mDoFCount;

	// update the w components of the Quaternions. They are stored at the end
	// of the q vector
	int multdof3_joint_counter = 0;
	for (unsigned int i = 1; i < mJoints.size(); i++) {
		if (mJoints[i].mJointType == JointTypeSpherical) {
			multdof3_w_index[i] = dof_count + multdof3_joint_counter;
			multdof3_joint_counter++;
		}
	}

	q_size = dof_count + multdof3_joint_counter;
	qdot_size = qdot_size + joint.mDoFCount;

	// we have to invert the transformation as it is later always used from the
	// child bodies perspective.
	X_T.push_back(joint_frame * movable_parent_transform);

	// Dynamic variables
	c.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	IA.push_back(SpatialMatrix::Zero(6,6));
	pA.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
	U.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

	d = VectorNd::Zero (mBodies.size());
	u = VectorNd::Zero (mBodies.size());

	f.push_back (SpatialVector (0., 0., 0., 0., 0., 0.));

	SpatialRigidBodyInertia rbi = SpatialRigidBodyInertia::createFromMassComInertiaC (body.mMass, body.mCenterOfMass, body.mInertia);

	Ic.push_back (rbi);
	I.push_back (rbi);
	hc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

	if (mBodies.size() == fixed_body_discriminator) {
		std::cerr << "Error: cannot add more than " << fixed_body_discriminator << " movable bodies. You need to modify Model::fixed_body_discriminator for this." << std::endl;
		assert (0);
		abort();
	}
	
	previously_added_body_id = mBodies.size() - 1;

	mJointUpdateOrder.clear();

	// update the joint order computation
	std::vector<std::pair<JointType, unsigned int> > joint_types;
	for (unsigned int i = 0; i < mJoints.size(); i++) {
		joint_types.push_back (std::pair<JointType, unsigned int> (mJoints[i].mJointType,i));
		mJointUpdateOrder.push_back (mJoints[i].mJointType);
	}

	mJointUpdateOrder.clear();
	JointType current_joint_type = JointTypeUndefined;
	while (joint_types.size() != 0) {
		current_joint_type = joint_types[0].first;

		std::vector<std::pair<JointType, unsigned int> >::iterator type_iter = joint_types.begin();

		while (type_iter != joint_types.end()) {
			if (type_iter->first == current_joint_type) {
				mJointUpdateOrder.push_back (type_iter->second);
				type_iter = joint_types.erase (type_iter);
			} else {
				++type_iter;
			}
		}
	}

//	for (unsigned int i = 0; i < mJointUpdateOrder.size(); i++) {
//		std::cout << "i = " << i << ": joint_id = " << mJointUpdateOrder[i] << " joint_type = " << mJoints[mJointUpdateOrder[i]].mJointType << std::endl;
//	}

	return previously_added_body_id;
}